

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O2

string * __thiscall
LinearRegression::generateParameters_abi_cxx11_
          (string *__return_storage_ptr__,LinearRegression *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  bool bVar1;
  unsigned_long uVar2;
  size_t sVar3;
  string local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string initParam;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  unsigned_long *local_290;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  var_bitset *local_228;
  var_bitset *local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string numOfParameters;
  string constructGrad;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string constructParam;
  
  this_00 = &this->_parameterIndex;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,0x65);
  offset_abi_cxx11_(&local_3b0,this,1);
  std::operator+(&initParam,&local_3b0,"size_t numberOfParameters;\n");
  uVar2 = 1;
  offset_abi_cxx11_(&local_370,this,1);
  std::operator+(&numOfParameters,&initParam,&local_370);
  std::operator+(&constructGrad,&numOfParameters,
                 "double stepSize, error, *params = nullptr, *grad = nullptr, ");
  std::operator+(&constructParam,&constructGrad,
                 "*lambda = nullptr, *prevParams = nullptr, *prevGrad = nullptr;\n");
  std::__cxx11::string::~string((string *)&constructGrad);
  std::__cxx11::string::~string((string *)&numOfParameters);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&initParam);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::string((string *)&constructGrad,"",(allocator *)&numOfParameters);
  std::__cxx11::string::string
            ((string *)&numOfParameters,"numberOfParameters = ",(allocator *)&initParam);
  local_220 = &(this->super_Application)._features;
  local_228 = &this->_categoricalFeatures;
  for (sVar3 = 0; sVar3 != 100; sVar3 = sVar3 + 1) {
    bVar1 = std::bitset<100UL>::test(local_220,sVar3);
    if (bVar1) {
      bVar1 = std::bitset<100UL>::test(local_228,sVar3);
      if (bVar1) {
        std::__cxx11::to_string
                  (&local_370,
                   **(unsigned_long **)
                     &((*(this->parameterQueries[sVar3]->_aggregates).
                         super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                         super__Vector_impl_data._M_start)->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data);
        std::operator+(&local_3b0,"V",&local_370);
        std::operator+(&initParam,&local_3b0,".size() + ");
        std::__cxx11::string::append((string *)&numOfParameters);
        std::__cxx11::string::~string((string *)&initParam);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_370);
      }
      else {
        (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[sVar3] = uVar2;
        uVar2 = uVar2 + 1;
      }
    }
  }
  (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[100] = 0;
  std::__cxx11::to_string(&local_3b0,uVar2 + 1);
  std::operator+(&initParam,&local_3b0,";\n");
  std::__cxx11::string::append((string *)&numOfParameters);
  std::__cxx11::string::~string((string *)&initParam);
  std::__cxx11::string::~string((string *)&local_3b0);
  offset_abi_cxx11_(&local_288,this,2);
  std::operator+(&local_248,&local_288,&numOfParameters);
  offset_abi_cxx11_(&local_198,this,2);
  std::operator+(&local_268,&local_248,&local_198);
  std::operator+(&local_2d0,&local_268,"params = new double[numberOfParameters];\n");
  offset_abi_cxx11_(&local_1b8,this,2);
  std::operator+(&local_310,&local_2d0,&local_1b8);
  std::operator+(&local_2b0,&local_310,"grad = new double[numberOfParameters]();\n");
  offset_abi_cxx11_(&local_1d8,this,2);
  std::operator+(&local_330,&local_2b0,&local_1d8);
  std::operator+(&local_350,&local_330,"prevParams = new double[numberOfParameters];\n");
  offset_abi_cxx11_(&local_1f8,this,2);
  std::operator+(&local_390,&local_350,&local_1f8);
  std::operator+(&local_370,&local_390,"prevGrad = new double[numberOfParameters];\n");
  offset_abi_cxx11_(&local_218,this,2);
  std::operator+(&local_3b0,&local_370,&local_218);
  std::operator+(&initParam,&local_3b0,"lambda = new double[numberOfParameters];\n");
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_288);
  if ((this->_categoricalFeatures).super__Base_bitset<2UL>._M_w[1] != 0 ||
      (this->_categoricalFeatures).super__Base_bitset<2UL>._M_w[0] != 0) {
    offset_abi_cxx11_(&local_350,this,2);
    std::operator+(&local_390,&local_350,"size_t categIndex = ");
    std::__cxx11::to_string(&local_330,uVar2 + 1);
    std::operator+(&local_370,&local_390,&local_330);
    std::operator+(&local_3b0,&local_370,";\n");
    std::__cxx11::string::append((string *)&initParam);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_350);
  }
  for (sVar3 = 0; sVar3 != 100; sVar3 = sVar3 + 1) {
    bVar1 = std::bitset<100UL>::test(local_220,sVar3);
    if (bVar1) {
      bVar1 = std::bitset<100UL>::test(local_228,sVar3);
      if (bVar1) {
        local_290 = *(unsigned_long **)
                     &((*(this->parameterQueries[sVar3]->_aggregates).
                         super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                         super__Vector_impl_data._M_start)->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data;
        offset_abi_cxx11_(&local_350,this,1);
        std::operator+(&local_390,&local_350,"std::unordered_map<int,size_t> index_");
        getAttributeName_abi_cxx11_(&local_330,this,sVar3);
        std::operator+(&local_370,&local_390,&local_330);
        std::operator+(&local_3b0,&local_370,";\n");
        std::__cxx11::string::append((string *)&constructGrad);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_350);
        offset_abi_cxx11_(&local_2b0,this,2);
        std::operator+(&local_330,&local_2b0,"index_");
        getAttributeName_abi_cxx11_(&local_310,this,sVar3);
        std::operator+(&local_350,&local_330,&local_310);
        std::operator+(&local_390,&local_350,".reserve(V");
        std::__cxx11::to_string(&local_2d0,*local_290);
        std::operator+(&local_370,&local_390,&local_2d0);
        std::operator+(&local_3b0,&local_370,".size());\n");
        std::__cxx11::string::append((string *)&initParam);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_2b0);
        offset_abi_cxx11_(&local_198,this,2);
        std::operator+(&local_288,&local_198,"for (V");
        std::__cxx11::to_string(&local_1b8,*local_290);
        std::operator+(&local_248,&local_288,&local_1b8);
        std::operator+(&local_268,&local_248,"_tuple& tuple : V");
        std::__cxx11::to_string(&local_1d8,*local_290);
        std::operator+(&local_2d0,&local_268,&local_1d8);
        std::operator+(&local_310,&local_2d0,")\n");
        offset_abi_cxx11_(&local_1f8,this,3);
        std::operator+(&local_2b0,&local_310,&local_1f8);
        std::operator+(&local_330,&local_2b0,"index_");
        getAttributeName_abi_cxx11_(&local_218,this,sVar3);
        std::operator+(&local_350,&local_330,&local_218);
        std::operator+(&local_390,&local_350,"[tuple.");
        getAttributeName_abi_cxx11_(&local_130,this,sVar3);
        std::operator+(&local_370,&local_390,&local_130);
        std::operator+(&local_3b0,&local_370,"] = categIndex++;\n");
        std::__cxx11::string::append((string *)&initParam);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_198);
      }
    }
  }
  offset_abi_cxx11_(&local_218,this,2);
  std::operator+(&local_1f8,&local_218,"for(size_t j = 0; j < numberOfParameters; ++j)\n");
  offset_abi_cxx11_(&local_130,this,2);
  std::operator+(&local_1d8,&local_1f8,&local_130);
  std::operator+(&local_1b8,&local_1d8,"{\n");
  offset_abi_cxx11_(&local_70,this,3);
  std::operator+(&local_198,&local_1b8,&local_70);
  std::operator+(&local_288,&local_198,"params[j] = ((double) (rand() % 800 + 1) - 400) / 100;\n");
  offset_abi_cxx11_(&local_90,this,3);
  std::operator+(&local_248,&local_288,&local_90);
  std::operator+(&local_268,&local_248,"lambda[j] = 0.1;\n");
  offset_abi_cxx11_(&local_b0,this,2);
  std::operator+(&local_2d0,&local_268,&local_b0);
  std::operator+(&local_310,&local_2d0,"}\n");
  offset_abi_cxx11_(&local_d0,this,2);
  std::operator+(&local_2b0,&local_310,&local_d0);
  std::operator+(&local_330,&local_2b0,"params[");
  std::__cxx11::to_string
            (&local_f0,
             (this->_parameterIndex).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[this->labelID]);
  std::operator+(&local_350,&local_330,&local_f0);
  std::operator+(&local_390,&local_350,"] = -1;\n");
  offset_abi_cxx11_(&local_110,this,2);
  std::operator+(&local_370,&local_390,&local_110);
  std::operator+(&local_3b0,&local_370,"lambda[0] = 0.0;\n");
  std::__cxx11::string::append((string *)&initParam);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::operator+(&local_2d0,&constructParam,&constructGrad);
  std::operator+(&local_310,&local_2d0,"\n");
  offset_abi_cxx11_(&local_268,this,1);
  std::operator+(&local_2b0,&local_310,&local_268);
  std::operator+(&local_330,&local_2b0,"void initParametersGradients()\n");
  offset_abi_cxx11_(&local_248,this,1);
  std::operator+(&local_350,&local_330,&local_248);
  std::operator+(&local_390,&local_350,"{\n");
  std::operator+(&local_370,&local_390,&initParam);
  offset_abi_cxx11_(&local_288,this,1);
  std::operator+(&local_3b0,&local_370,&local_288);
  std::operator+(__return_storage_ptr__,&local_3b0,"}\n");
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&initParam);
  std::__cxx11::string::~string((string *)&numOfParameters);
  std::__cxx11::string::~string((string *)&constructGrad);
  std::__cxx11::string::~string((string *)&constructParam);
  return __return_storage_ptr__;
}

Assistant:

std::string LinearRegression::generateParameters()
{
    _parameterIndex.resize(NUM_OF_VARIABLES+1);
    
    std::string constructParam = offset(1)+"size_t numberOfParameters;\n"+
        offset(1)+"double stepSize, error, *params = nullptr, *grad = nullptr, "+
        "*lambda = nullptr, *prevParams = nullptr, *prevGrad = nullptr;\n";
    
    std::string constructGrad = "";

    std::string numOfParameters = "numberOfParameters = ";
    size_t numOfContParameters = 1;
    
    // Computing the number of parameters we have
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features.test(var))
            continue;
        if (!_categoricalFeatures.test(var))
        {
            _parameterIndex[var] = numOfContParameters;
            ++numOfContParameters;
        }
        else
        {
            size_t& viewID = parameterQueries[var]->_aggregates[0]->_incoming[0].first;
            numOfParameters += "V"+std::to_string(viewID)+".size() + ";
        }
    }
    _parameterIndex[NUM_OF_VARIABLES] = 0;
    numOfParameters += std::to_string(numOfContParameters+1)+";\n";
    
    std::string initParam = offset(2)+numOfParameters+
        offset(2)+"params = new double[numberOfParameters];\n"+
        offset(2)+"grad = new double[numberOfParameters]();\n"+
        offset(2)+"prevParams = new double[numberOfParameters];\n"+
        offset(2)+"prevGrad = new double[numberOfParameters];\n"+
        offset(2)+"lambda = new double[numberOfParameters];\n";

    // TODO: make sure you initialize the params and grad arrays
    if (_categoricalFeatures.any()) 
        initParam += offset(2)+"size_t categIndex = "+
            std::to_string(numOfContParameters+1)+";\n";
    
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features.test(var))
            continue;

        if (_categoricalFeatures.test(var))
        {
            size_t& viewID = parameterQueries[var]->_aggregates[0]->_incoming[0].first;
            
            constructGrad += offset(1)+"std::unordered_map<int,size_t> index_"+
                getAttributeName(var)+";\n";

            initParam += offset(2)+"index_"+getAttributeName(var)+".reserve(V"+
                std::to_string(viewID)+".size());\n";
            // offset(2)+"firstindex_"+getAttributeName(var)+" = categIndex;\n";

            initParam += offset(2)+"for (V"+std::to_string(viewID)+
                "_tuple& tuple : V"+
                std::to_string(viewID)+")\n"+
                offset(3)+"index_"+getAttributeName(var)+
                "[tuple."+getAttributeName(var)+"] = categIndex++;\n";
        }
    }

    initParam += offset(2)+"for(size_t j = 0; j < numberOfParameters; ++j)\n"+
        offset(2)+"{\n"+
        offset(3)+"params[j] = ((double) (rand() % 800 + 1) - 400) / 100;\n"+
        offset(3)+"lambda[j] = 0.1;\n"+
        offset(2)+"}\n"+
        offset(2)+"params["+std::to_string(_parameterIndex[labelID])+"] = -1;\n"+
        offset(2)+"lambda[0] = 0.0;\n";
    
    std::string outString = constructParam+constructGrad+"\n"+
        offset(1)+"void initParametersGradients()\n"+
        offset(1)+"{\n"+initParam+offset(1)+"}\n";
    
    return outString;
}